

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFile.cc
# Opt level: O2

ostream * avro::operator<<(ostream *os,DataFileSync *s)

{
  char cVar1;
  ostream *poVar2;
  byte bVar3;
  size_t i;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    cVar1 = 'W';
    if (s->elems[lVar4] < 0xa0) {
      cVar1 = '0';
    }
    poVar2 = std::operator<<(os,cVar1 + (s->elems[lVar4] >> 4));
    bVar3 = s->elems[lVar4] & 0xf;
    cVar1 = 'W';
    if (bVar3 < 10) {
      cVar1 = '0';
    }
    poVar2 = std::operator<<(poVar2,cVar1 + bVar3);
    std::operator<<(poVar2,' ');
  }
  std::endl<char,std::char_traits<char>>(os);
  return os;
}

Assistant:

std::ostream& operator << (std::ostream& os, const DataFileSync& s)
{
    for (size_t i = 0; i < s.size(); ++i) {
        os << hex(s[i] / 16)  << hex(s[i] % 16) << ' ';
    }
    os << std::endl;
    return os;
}